

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rate_Coding_Synchronized_IAF_SNN_Results.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  int param;
  char local_res1f;
  string local_res40;
  
  iVar1 = run();
  return iVar1;
}

Assistant:

int main() 
{
    try {
        return run();
    }
    catch (int param) { cout << "int exception"; }
    catch (char param) { cout << "char exception"; }
    catch (string param) { cout << "string exception: " + param; }
    catch (...) { cout << "default exception"; }
}